

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O2

void __thiscall
QArrayDataPointer<QXdgDesktopPortalFileDialog::Filter>::~QArrayDataPointer
          (QArrayDataPointer<QXdgDesktopPortalFileDialog::Filter> *this)

{
  Data *pDVar1;
  
  pDVar1 = this->d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QtPrivate::QGenericArrayOps<QXdgDesktopPortalFileDialog::Filter>::destroyAll
                ((QGenericArrayOps<QXdgDesktopPortalFileDialog::Filter> *)this);
      QTypedArrayData<QXdgDesktopPortalFileDialog::Filter>::deallocate(&this->d->super_QArrayData);
      return;
    }
  }
  return;
}

Assistant:

bool deref() noexcept { return !d || d->deref(); }